

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

string * __thiscall
Catch::StringMaker<char_const*,void>::convert_abi_cxx11_
          (string *__return_storage_ptr__,StringMaker<char_const*,void> *this,char *str)

{
  allocator<char> local_31;
  string local_30;
  
  if (this == (StringMaker<char_const*,void> *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"{null string}",(allocator<char> *)&local_30);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,(char *)this,&local_31);
    StringMaker<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::convert(__return_storage_ptr__,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringMaker<char const *>::convert(char const *str) {
        if (str) {
            return ::Catch::Detail::stringify(std::string{ str });
        }
        else {
            return{ "{null string}" };
        }
    }